

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O0

int segwit_addr_decode(int *witver,uint8_t *witdata,size_t *witdata_len,char *hrp,char *addr)

{
  int iVar1;
  _Bool local_101;
  ulong uStack_100;
  _Bool is_bech32m;
  size_t data_len;
  char hrp_actual [84];
  byte local_98;
  uint8_t auStack_97 [7];
  uint8_t data [84];
  char *addr_local;
  char *hrp_local;
  size_t *witdata_len_local;
  uint8_t *witdata_local;
  int *witver_local;
  
  local_101 = false;
  iVar1 = bech32_decode((char *)&data_len,&local_98,&stack0xffffffffffffff00,addr,0x5a,&local_101);
  if (((((iVar1 != 0) && (uStack_100 != 0)) && (uStack_100 < 0x42)) &&
      ((iVar1 = strncmp(hrp,(char *)&data_len,0x54), iVar1 == 0 &&
       ((local_98 != 0 || ((local_101 & 1U) == 0)))))) &&
     (((local_98 == 0 || ((local_101 & 1U) != 0)) && (local_98 < 0x11)))) {
    *witdata_len = 0;
    iVar1 = convert_bits(witdata,witdata_len,8,auStack_97,uStack_100 - 1,5,0);
    if (((iVar1 != 0) && (1 < *witdata_len)) &&
       ((*witdata_len < 0x29 &&
        (((local_98 != 0 || (*witdata_len == 0x14)) || (*witdata_len == 0x20)))))) {
      *witver = (uint)local_98;
      return 1;
    }
  }
  wally_clear_2(&local_98,0x54,&data_len,0x54);
  return 0;
}

Assistant:

static int segwit_addr_decode(int *witver, uint8_t *witdata, size_t *witdata_len, const char *hrp, const char *addr) {
    uint8_t data[84];
    char hrp_actual[84];
    size_t data_len;
    bool is_bech32m = false;
    if (!bech32_decode(hrp_actual, data, &data_len, addr, 90, &is_bech32m)) goto fail;
    if (data_len == 0 || data_len > 65) goto fail;
    if (strncmp(hrp, hrp_actual, 84) != 0) goto fail;
    if (data[0] == 0 && is_bech32m) goto fail;
    if (data[0] != 0 && !is_bech32m) goto fail;
    if (data[0] > 16) goto fail;
    *witdata_len = 0;
    if (!convert_bits(witdata, witdata_len, 8, data + 1, data_len - 1, 5, 0)) goto fail;
    if (*witdata_len < 2 || *witdata_len > 40) goto fail;
    if (data[0] == 0 && *witdata_len != 20 && *witdata_len != 32) goto fail;
    // if (data[0] == 1 && *witdata_len != 32) goto fail;
    *witver = data[0];
    return 1;
fail:
    wally_clear_2(data, sizeof(data), hrp_actual, sizeof(hrp_actual));
    return 0;
}